

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

void __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
initialise(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this,CodeLocation *code)

{
  SourceCodeText *pSVar1;
  SourceCodeText *pSVar2;
  char *pcVar3;
  
  pSVar1 = (code->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = (this->startLocation).sourceCode.object;
  (this->startLocation).sourceCode.object = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
  (this->startLocation).location.data = (code->location).data;
  pSVar1 = (code->sourceCode).object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  pSVar2 = (this->location).sourceCode.object;
  (this->location).sourceCode.object = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar2);
  pcVar3 = (code->location).data;
  (this->location).location.data = pcVar3;
  (this->input).data = pcVar3;
  skip(this);
  return;
}

Assistant:

void initialise (const CodeLocation& code)
    {
        startLocation = code;
        location = code;
        input = location.location;
        skip();
    }